

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

bool __thiscall
AbstractModuleClient::sendGlobalStimulationCommand
          (AbstractModuleClient *this,GlobalStimulationCommand *command)

{
  bool bVar1;
  TrodesMsg m;
  allocator local_79;
  binarydata local_78;
  string local_58;
  TrodesMsg local_38;
  
  TrodesMsg::TrodesMsg(&local_38);
  std::__cxx11::string::string((string *)&local_58,"sn",&local_79);
  GlobalStimulationCommand::encode(&local_78,command);
  TrodesMsg::addcontents<char_const*,binarydata>(&local_38,&local_58,"SETGC",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = MlmWrap::sendHardwareMessage(&this->super_MlmWrap,&local_38);
  TrodesMsg::~TrodesMsg(&local_38);
  return bVar1;
}

Assistant:

bool AbstractModuleClient::sendGlobalStimulationCommand(GlobalStimulationCommand command){
    TrodesMsg m;
    m.addcontents("sn", "SETGC", command.encode());
    return sendHardwareMessage(m);
}